

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::StrictEqualEmptyString(Var aLeft)

{
  bool bVar1;
  charcount_t cVar2;
  JavascriptString *this;
  uint uVar3;
  
  bVar1 = VarIs<Js::JavascriptString>(aLeft);
  uVar3 = 0;
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptString>(aLeft);
    if (this != (JavascriptString *)0x0) {
      cVar2 = JavascriptString::GetLength(this);
      uVar3 = (uint)(cVar2 == 0);
    }
  }
  return uVar3;
}

Assistant:

BOOL JavascriptOperators::StrictEqualEmptyString(Var aLeft)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_StrictEqualEmptyString);
        JavascriptString * string = JavascriptOperators::TryFromVar<JavascriptString>(aLeft);
        if (!string)
        {
            return false;
        }

        Assert(string);
        return string->GetLength() == 0;
        JIT_HELPER_END(Op_StrictEqualEmptyString);
    }